

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

MatcherBase<const_int_&> * __thiscall
testing::internal::MatcherBase<const_int_&>::operator=
          (MatcherBase<const_int_&> *this,MatcherBase<const_int_&> *other)

{
  SharedPayloadBase *pSVar1;
  
  if (this != other) {
    if ((this->vtable_ != (VTable *)0x0) &&
       (this->vtable_->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
      pSVar1 = (this->buffer_).shared;
      LOCK();
      (pSVar1->ref).super___atomic_base<int>._M_i = (pSVar1->ref).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((pSVar1->ref).super___atomic_base<int>._M_i == 0) {
        (*this->vtable_->shared_destroy)((SharedPayloadBase *)(this->buffer_).ptr);
      }
    }
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }